

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_update_pfx_table(rtr_socket *rtr_socket,pfx_table *pfx_table,void *pdu)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint32_t erroneous_pdu_len;
  long in_FS_OFFSET;
  char txt [30];
  pfx_record pfxr;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    builtin_strncpy(txt + 0x10,"G ROA OBJECTS",0xe);
    builtin_strncpy(txt,"IGNORING INCOMIN",0x10);
    iVar4 = 0;
    lrtr_dbg("RTR Socket: %s");
    goto LAB_0010b33d;
  }
  bVar1 = *(byte *)((long)pdu + 1);
  if ((bVar1 | 2) != 6) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x3b9,
                  "int rtr_update_pfx_table(struct rtr_socket *, struct pfx_table *, const void *)")
    ;
  }
  erroneous_pdu_len = 0x20;
  if (bVar1 == 4) {
    erroneous_pdu_len = 0x14;
  }
  rtr_prefix_pdu_2_pfx_record(rtr_socket,pdu,&pfxr,(uint)bVar1);
  if (*(char *)((long)pdu + 8) == '\0') {
    iVar3 = pfx_table_remove(pfx_table,&pfxr);
LAB_0010b222:
    if (iVar3 == -3) {
      lrtr_dbg("RTR Socket: Withdrawal of unknown record");
      rtr_send_error_pdu_from_host
                (rtr_socket,pdu,erroneous_pdu_len,WITHDRAWAL_OF_UNKNOWN_RECORD,(char *)0x0,0);
    }
    else if (iVar3 == -1) {
      builtin_strncpy(txt,"PFX_TABLE Error",0x10);
      lrtr_dbg("RTR Socket: %s");
    }
    else {
      iVar4 = 0;
      if (iVar3 != -2) goto LAB_0010b33d;
      lrtr_ip_addr_to_str(&pfxr.prefix,txt,0x2e);
      lrtr_dbg("RTR Socket: Duplicate Announcement for record: %s/%u-%u, ASN: %u, received",txt,
               (ulong)pfxr.min_len,(ulong)pfxr.max_len);
      rtr_send_error_pdu_from_host
                (rtr_socket,pdu,erroneous_pdu_len,DUPLICATE_ANNOUNCEMENT,(char *)0x0,0);
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
  }
  else {
    if (*(char *)((long)pdu + 8) == '\x01') {
      iVar3 = pfx_table_add(pfx_table,&pfxr);
      goto LAB_0010b222;
    }
    builtin_strncpy(txt + 0x10,"invalid flags ",0xe);
    builtin_strncpy(txt,"Prefix PDU with ",0x10);
    lrtr_dbg("RTR Socket: %s",txt);
    rtr_send_error_pdu_from_host(rtr_socket,pdu,erroneous_pdu_len,CORRUPT_DATA,txt,0x2d);
  }
  iVar4 = -1;
LAB_0010b33d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int rtr_update_pfx_table(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table, const void *pdu)
{
	// the prefix table was not initialized, hence we ignore incoming ROA Objects
	if (pfx_table == NULL) {
		const char txt[] = "IGNORING INCOMING ROA OBJECTS";
		RTR_DBG("%s", txt);
		return RTR_SUCCESS;
	}

	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);

	struct pfx_record pfxr;
	size_t pdu_size = (type == IPV4_PREFIX ? sizeof(struct pdu_ipv4) : sizeof(struct pdu_ipv6));

	rtr_prefix_pdu_2_pfx_record(rtr_socket, pdu, &pfxr, type);

	int rtval;

	if (((struct pdu_ipv4 *)pdu)->flags == 1) { // add record
		rtval = pfx_table_add(pfx_table, &pfxr);
	} else if (((struct pdu_ipv4 *)pdu)->flags == 0) { // remove record
		rtval = pfx_table_remove(pfx_table, &pfxr);
	} else {
		const char txt[] = "Prefix PDU with invalid flags value received";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, CORRUPT_DATA, txt, sizeof(txt));
		return RTR_ERROR;
	}

	if (rtval == PFX_DUPLICATE_RECORD) {
		char ip[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&(pfxr.prefix), ip, INET6_ADDRSTRLEN);
		RTR_DBG("Duplicate Announcement for record: %s/%u-%u, ASN: %u, received", ip, pfxr.min_len,
			pfxr.max_len, pfxr.asn);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, DUPLICATE_ANNOUNCEMENT, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_RECORD_NOT_FOUND) {
		RTR_DBG1("Withdrawal of unknown record");
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, WITHDRAWAL_OF_UNKNOWN_RECORD, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == PFX_ERROR) {
		const char txt[] = "PFX_TABLE Error";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	return RTR_SUCCESS;
}